

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alffplay.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  MovieState *pMVar1;
  SwsContextPtr *this;
  mutex *__mutex;
  long lVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  AVClass *pAVar7;
  double dVar8;
  double dVar9;
  __pthread_internal_list *rhs;
  byte bVar10;
  char cVar11;
  bool bVar12;
  int iVar13;
  undefined4 uVar14;
  int iVar15;
  uint uVar16;
  size_t sVar17;
  AVStream *pAVar18;
  long lVar19;
  undefined8 uVar20;
  MovieState *this_00;
  nanoseconds nVar21;
  SDL_Texture *pSVar22;
  AVCodecContext *pAVar23;
  pointer __p;
  undefined4 uVar24;
  long lVar25;
  ulong uVar26;
  AVCodecContext *in_RSI;
  char *pcVar27;
  MovieState *pMVar28;
  undefined1 *puVar29;
  _Head_base<0UL,_AVFrame_*,_false> __ptr;
  uint in_EDI;
  SwsContext *pSVar30;
  Picture *pPVar31;
  ulong uVar32;
  pointer __old_p;
  int pitch;
  uint8_t *pict_data [3];
  void *pixels;
  int pict_linesize [3];
  SDL_RendererInfo rinf;
  int *in_stack_fffffffffffffe78;
  uint local_15c;
  _Head_base<0UL,_AVFrame_*,_false> local_158;
  int local_14c;
  double local_148;
  long local_140;
  undefined1 local_138 [32];
  Picture *local_118;
  MovieState *local_110;
  AVStream *local_108;
  _Head_base<0UL,_AVCodecContext_*,_false> local_100;
  __native_type local_f8;
  long local_d0;
  undefined1 local_c8 [32];
  undefined1 local_a8 [32];
  undefined1 local_88 [72];
  seconds_d64 sStack_40;
  nanoseconds local_38;
  
  local_15c = in_EDI;
  local_100._M_head_impl = in_RSI;
  if ((int)in_EDI < 2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Usage: ",7);
    pAVar7 = in_RSI->av_class;
    if (pAVar7 == (AVClass *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x1101f0);
    }
    else {
      sVar17 = strlen((char *)pAVar7);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,(char *)pAVar7,sVar17);
    }
    pcVar27 = " [-device <device name>] [-direct] <files...>";
    sVar17 = 0x2d;
  }
  else {
    avformat_network_init();
    iVar13 = SDL_Init(0x4020);
    if (iVar13 == 0) {
      pAVar18 = (AVStream *)
                SDL_CreateWindow((anonymous_namespace)::AppName_abi_cxx11_,0,0,0x280,0x1e0,0x20);
      if (pAVar18 == (AVStream *)0x0) {
        pcVar27 = "SDL: could not set video mode - exiting";
        sVar17 = 0x27;
      }
      else {
        lVar19 = SDL_CreateRenderer(pAVar18,0xffffffff,6);
        if (lVar19 == 0) {
LAB_00104de9:
          lVar19 = SDL_CreateRenderer(pAVar18,0xffffffff,5);
          if (lVar19 == 0) {
            pcVar27 = "SDL: could not create renderer - exiting";
            sVar17 = 0x28;
            goto LAB_00104c20;
          }
        }
        else {
          local_88._64_8_ = (__pthread_internal_list *)0x0;
          sStack_40.__r = 0.0;
          local_88._48_8_ = 0;
          local_88._56_8_ = (__pthread_internal_list *)0x0;
          local_88._32_8_ = 0;
          local_88._40_8_ = 0;
          local_88._16_8_ = (AVStream *)0x0;
          local_88._24_8_ =
               (__uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>)0x0;
          local_88._0_8_ = (_Elt_pointer)0x0;
          local_88._8_8_ = (MovieState *)0x0;
          local_38.__r = 0;
          iVar13 = SDL_GetRendererInfo(lVar19);
          if ((iVar13 != 0) || ((ulong)local_88._8_8_ >> 0x20 == 0)) {
LAB_00104ce6:
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"IYUV pixelformat textures not supported on renderer ",
                       0x34);
            uVar20 = local_88._0_8_;
            if ((_Elt_pointer)local_88._0_8_ == (_Elt_pointer)0x0) {
              std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x1101f0);
            }
            else {
              sVar17 = strlen((char *)local_88._0_8_);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(char *)uVar20,sVar17);
            }
            std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x10);
            std::ostream::put(-0x10);
            std::ostream::flush();
            SDL_DestroyRenderer(lVar19);
            goto LAB_00104de9;
          }
          lVar25 = 4;
          do {
            lVar2 = lVar25 * 4;
            if (*(int *)(local_88 + lVar2) == 0x56555949) break;
            uVar32 = lVar25 - 3;
            lVar25 = lVar25 + 1;
          } while (uVar32 < (ulong)local_88._8_8_ >> 0x20);
          if (*(int *)(local_88 + lVar2) != 0x56555949) goto LAB_00104ce6;
        }
        SDL_SetRenderDrawColor(lVar19,0,0,0,0xff);
        SDL_RenderFillRect(lVar19,0);
        SDL_RenderPresent(lVar19);
        local_100._M_head_impl = (AVCodecContext *)&(local_100._M_head_impl)->log_level_offset;
        local_15c = local_15c - 1;
        iVar13 = InitAL((char ***)&local_100,(int *)&local_15c);
        if (iVar13 == 0) {
          uVar20 = alcGetCurrentContext();
          uVar20 = alcGetContextsDevice(uVar20);
          cVar11 = alcIsExtensionPresent(uVar20,"ALC_SOFT_device_clock");
          if (cVar11 != '\0') {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Found ALC_SOFT_device_clock",0x1b);
            std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
            (anonymous_namespace)::alcGetInteger64vSOFT =
                 alcGetProcAddress(uVar20,"alcGetInteger64vSOFT");
          }
          cVar11 = alIsExtensionPresent("AL_SOFT_source_latency");
          if (cVar11 != '\0') {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Found AL_SOFT_source_latency",0x1c);
            std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
            (anonymous_namespace)::alGetSourcei64vSOFT = alGetProcAddress("alGetSourcei64vSOFT");
          }
          cVar11 = alIsExtensionPresent("AL_SOFT_events");
          if (cVar11 != '\0') {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Found AL_SOFT_events",0x14);
            std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
            (anonymous_namespace)::alEventControlSOFT = alGetProcAddress("alEventControlSOFT");
            (anonymous_namespace)::alEventCallbackSOFT = alGetProcAddress("alEventCallbackSOFT");
          }
          cVar11 = alIsExtensionPresent("AL_SOFTX_callback_buffer");
          if (cVar11 != '\0') {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Found AL_SOFT_callback_buffer",0x1d);
            std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
            (anonymous_namespace)::alBufferCallbackSOFT = alGetProcAddress("alBufferCallbackSOFT");
          }
          uVar26 = (ulong)local_15c;
          uVar32 = 0;
          uVar16 = local_15c;
          local_140 = lVar19;
          local_108 = pAVar18;
          if (0 < (int)local_15c) {
            do {
              pAVar7 = (&(local_100._M_head_impl)->av_class)[uVar32];
              iVar13 = strcmp((char *)pAVar7,"-direct");
              if (iVar13 == 0) {
                cVar11 = alIsExtensionPresent("AL_SOFT_direct_channels_remix");
                if (cVar11 == '\0') {
                  cVar11 = alIsExtensionPresent("AL_SOFT_direct_channels");
                  if (cVar11 == '\0') {
                    lVar19 = 0x37;
                    pcVar27 = "AL_SOFT_direct_channels not supported for direct output";
                    goto LAB_00105179;
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"Found AL_SOFT_direct_channels",0x1d);
                  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
                  std::ostream::put(-0x28);
                  std::ostream::flush();
                  (anonymous_namespace)::DirectOutMode = 1;
                }
                else {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"Found AL_SOFT_direct_channels_remix",0x23);
                  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
                  std::ostream::put(-0x28);
                  std::ostream::flush();
                  (anonymous_namespace)::DirectOutMode = 2;
                }
              }
              else {
                iVar13 = strcmp((char *)pAVar7,"-wide");
                if (iVar13 == 0) {
                  cVar11 = alIsExtensionPresent("AL_EXT_STEREO_ANGLES");
                  if (cVar11 == '\0') {
                    lVar19 = 0x32;
                    pcVar27 = "AL_EXT_STEREO_ANGLES not supported for wide stereo";
LAB_00105179:
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,pcVar27,lVar19);
                    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x10);
                    std::ostream::put(-0x10);
                    std::ostream::flush();
                  }
                  else {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"Found AL_EXT_STEREO_ANGLES",0x1a);
                    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
                    std::ostream::put(-0x28);
                    std::ostream::flush();
                    (anonymous_namespace)::EnableWideStereo = 1;
                  }
                }
                else {
                  iVar13 = strcmp((char *)pAVar7,"-novideo");
                  uVar16 = (uint)uVar26;
                  if (iVar13 != 0) break;
                  (anonymous_namespace)::DisableVideo = 1;
                }
              }
              uVar32 = uVar32 + 1;
              uVar26 = (ulong)(int)local_15c;
              uVar16 = local_15c;
            } while ((long)uVar32 < (long)uVar26);
          }
          if ((int)uVar32 < (int)uVar16) {
            uVar32 = uVar32 & 0xffffffff;
            this_00 = (MovieState *)0x0;
            do {
              if (this_00 != (MovieState *)0x0) goto LAB_00105288;
              this_00 = (MovieState *)operator_new(0x5c0);
              std::__cxx11::string::string
                        ((string *)local_a8,(char *)(&(local_100._M_head_impl)->av_class)[uVar32],
                         (allocator *)local_88);
              pMVar28 = (MovieState *)local_a8;
              anon_unknown.dwarf_e2e2::MovieState::MovieState(this_00,(string *)local_a8);
              if (local_a8._0_8_ != (long)local_a8 + 0x10) {
                pMVar28 = (MovieState *)((long)(int *)local_a8._16_8_ + 1);
                operator_delete((void *)local_a8._0_8_,(ulong)pMVar28);
              }
              bVar12 = anon_unknown.dwarf_e2e2::MovieState::prepare(this_00);
              if (!bVar12) {
                std::default_delete<(anonymous_namespace)::MovieState>::operator()
                          ((default_delete<(anonymous_namespace)::MovieState> *)this_00,pMVar28);
                this_00 = (MovieState *)0x0;
              }
              uVar32 = uVar32 + 1;
            } while ((int)uVar32 < (int)local_15c);
            if (this_00 != (MovieState *)0x0) {
LAB_00105288:
              anon_unknown.dwarf_e2e2::MovieState::setTitle(this_00,(SDL_Window *)local_108);
              local_110 = (MovieState *)0x0;
              local_f8.__data.__list.__next = (__pthread_internal_list *)0x8000000000000000;
              do {
                local_88._32_8_ = 0;
                local_88._40_8_ = 0;
                local_88._16_8_ = (AVStream *)0x0;
                local_88._24_8_ =
                     (__uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>)0x0;
                local_88._0_8_ = (_Elt_pointer)0x0;
                local_88._8_8_ = (MovieState *)0x0;
                local_88._48_8_ = 0;
                uVar14 = SDL_WaitEventTimeout(local_88,10);
                local_158._M_head_impl._0_4_ = uVar14;
                nVar21 = anon_unknown.dwarf_e2e2::MovieState::getMasterClock(this_00);
                rhs = (__pthread_internal_list *)(nVar21.__r / 1000000000);
                if (rhs != local_f8.__data.__list.__next) {
                  lVar19 = ((this_00->mFormatCtx)._M_t.
                            super___uniq_ptr_impl<AVFormatContext,_(anonymous_namespace)::AVFormatCtxDeleter>
                            ._M_t.
                            super__Tuple_impl<0UL,_AVFormatContext_*,_(anonymous_namespace)::AVFormatCtxDeleter>
                            .super__Head_base<0UL,_AVFormatContext_*,_false>._M_head_impl)->duration
                  ;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"    \r ",6);
                  anon_unknown.dwarf_e2e2::operator<<((ostream *)&std::cout,(PrettyTime *)rhs);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," / ",3);
                  anon_unknown.dwarf_e2e2::operator<<
                            ((ostream *)&std::cout,(PrettyTime *)(lVar19 / 1000000));
                  std::ostream::flush();
                  local_f8.__data.__list.__next = rhs;
                }
                if ((uint)local_158._M_head_impl == 0) {
                  local_158._M_head_impl = (AVFrame *)((ulong)local_158._M_head_impl._4_4_ << 0x20);
                }
                else {
                  local_158._M_head_impl = (AVFrame *)((ulong)local_158._M_head_impl._4_4_ << 0x20);
                  do {
                    if ((int)local_88._0_4_ < 0x300) {
                      if (local_88._0_4_ == 0x100) {
LAB_00105471:
                        LOCK();
                        (this_00->mQuit)._M_base._M_i = true;
                        UNLOCK();
                        local_110 = (MovieState *)0x1;
                      }
                      else if (local_88._0_4_ == 0x200) {
                        if (local_88[0xc] == '\x03') {
                          local_158._M_head_impl._0_4_ = 1;
                        }
                        else if (local_88[0xc] == '\x05') {
                          uVar20 = SDL_SetRenderDrawColor(local_140,0,0,0,0xff);
                          local_158._M_head_impl._0_4_ = (int)CONCAT71((int7)((ulong)uVar20 >> 8),1)
                          ;
                          SDL_RenderFillRect(local_140);
                        }
                      }
                    }
                    else if (local_88._0_4_ == 0x8000) {
                      local_138[0] = 10;
                      pMVar28 = (MovieState *)local_138;
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,(char *)local_138,1);
                      if ((int)local_110 == 1) {
                        if (this_00 != (MovieState *)0x0) {
                          std::default_delete<(anonymous_namespace)::MovieState>::operator()
                                    ((default_delete<(anonymous_namespace)::MovieState> *)this_00,
                                     pMVar28);
                        }
LAB_00105cdd:
                        CloseAL();
                        SDL_DestroyRenderer(local_140);
                        SDL_DestroyWindow();
                        SDL_Quit();
                        exit(0);
                      }
                      if (this_00 != (MovieState *)0x0) {
                        std::default_delete<(anonymous_namespace)::MovieState>::operator()
                                  ((default_delete<(anonymous_namespace)::MovieState> *)this_00,
                                   pMVar28);
                      }
                      if ((int)local_15c <= (int)uVar32) goto LAB_00105cdd;
                      uVar26 = (long)(int)uVar32;
                      do {
                        uVar32 = uVar26 + 1;
                        this_00 = (MovieState *)operator_new(0x5c0);
                        std::__cxx11::string::string
                                  ((string *)local_c8,
                                   (char *)(&(local_100._M_head_impl)->av_class)[uVar26],
                                   (allocator *)local_138);
                        pMVar28 = (MovieState *)local_c8;
                        anon_unknown.dwarf_e2e2::MovieState::MovieState(this_00,(string *)local_c8);
                        if (local_c8._0_8_ != (long)local_c8 + 0x10) {
                          pMVar28 = (MovieState *)(local_c8._16_8_ + 1);
                          operator_delete((void *)local_c8._0_8_,(ulong)pMVar28);
                        }
                        bVar12 = anon_unknown.dwarf_e2e2::MovieState::prepare(this_00);
                        if (bVar12) {
                          if ((long)(int)local_15c <= (long)uVar32) break;
                        }
                        else {
                          std::default_delete<(anonymous_namespace)::MovieState>::operator()
                                    ((default_delete<(anonymous_namespace)::MovieState> *)this_00,
                                     pMVar28);
                          if ((long)(int)local_15c <= (long)uVar32) goto LAB_00105cdd;
                          this_00 = (MovieState *)0x0;
                        }
                        uVar26 = uVar32;
                      } while (this_00 == (MovieState *)0x0);
                      anon_unknown.dwarf_e2e2::MovieState::setTitle(this_00,(SDL_Window *)local_108)
                      ;
                      local_110 = (MovieState *)0x0;
                      local_f8.__data.__list.__next = (__pthread_internal_list *)0x8000000000000000;
                    }
                    else if (local_88._0_4_ == 0x300) {
                      if (local_88._20_4_ == 0x6e) {
                        LOCK();
                        (this_00->mQuit)._M_base._M_i = true;
                        UNLOCK();
                        local_110 = (MovieState *)0x0;
                      }
                      else if (local_88._20_4_ == 0x1b) goto LAB_00105471;
                    }
                    iVar13 = SDL_PollEvent(local_88);
                  } while (iVar13 != 0);
                }
                pMVar28 = (MovieState *)
                          (this_00->mVideo).mPictQRead.super___atomic_base<unsigned_long>._M_i;
                nVar21 = anon_unknown.dwarf_e2e2::MovieState::getMasterClock
                                   ((this_00->mVideo).mMovie);
                puVar29 = (undefined1 *)
                          ((long)&(pMVar28->mIOContext)._M_t.
                                  super___uniq_ptr_impl<AVIOContext,_(anonymous_namespace)::AVIOContextDeleter>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_AVIOContext_*,_(anonymous_namespace)::AVIOContextDeleter>
                          + 1);
                pPVar31 = (this_00->mVideo).mPictQ._M_elems + (long)pMVar28;
                __ptr._M_head_impl =
                     (AVFrame *)(puVar29 + ((ulong)puVar29 / 3 & 0xfffffffffffffff8) * -3);
                if (((MovieState *)__ptr._M_head_impl ==
                     (MovieState *)
                     (this_00->mVideo).mPictQWrite.super___atomic_base<unsigned_long>._M_i) ||
                   (lVar19 = (this_00->mVideo).mPictQ._M_elems[(long)__ptr._M_head_impl].mPts.__r,
                   nVar21.__r < lVar19)) {
                  if (((((this_00->mVideo).mMovie)->mQuit)._M_base._M_i & 1U) == 0) {
LAB_001056f1:
                    if (((ulong)local_158._M_head_impl & 1) != 0) {
                      uVar26 = 0;
                      local_118 = pPVar31;
                      goto LAB_00105ab0;
                    }
                    goto LAB_00105c59;
                  }
LAB_0010563a:
                  if (((this_00->mVideo).mEOS._M_base._M_i & 1U) != 0) {
                    LOCK();
                    (this_00->mVideo).mFinalUpdate._M_base._M_i = true;
                    UNLOCK();
                  }
                  (this_00->mVideo).mPictQRead.super___atomic_base<unsigned_long>._M_i =
                       (__int_type_conflict)pMVar28;
                  local_138._0_8_ = &(this_00->mVideo).mPictQMutex;
                  local_138._8_8_ = (ulong)(uint7)local_138._9_7_ << 8;
                  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_138);
                  local_138[8] = 1;
                  std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_138);
                  goto LAB_0010567e;
                }
                do {
                  pMVar28 = (MovieState *)__ptr._M_head_impl;
                  pPVar31 = (this_00->mVideo).mPictQ._M_elems + (long)pMVar28;
                  pMVar1 = (MovieState *)
                           ((long)&(pMVar28->mIOContext)._M_t.
                                   super___uniq_ptr_impl<AVIOContext,_(anonymous_namespace)::AVIOContextDeleter>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_AVIOContext_*,_(anonymous_namespace)::AVIOContextDeleter>
                           + 1);
                  __ptr._M_head_impl = (AVFrame *)(MovieState *)0x0;
                  if (pMVar1 != (MovieState *)0x18) {
                    __ptr._M_head_impl = (AVFrame *)pMVar1;
                  }
                  local_118 = pPVar31;
                  if ((MovieState *)__ptr._M_head_impl ==
                      (MovieState *)
                      (this_00->mVideo).mPictQWrite.super___atomic_base<unsigned_long>._M_i) {
                    if (((((this_00->mVideo).mMovie)->mQuit)._M_base._M_i & 1U) == 0)
                    goto LAB_0010571f;
                    goto LAB_0010563a;
                  }
                } while ((this_00->mVideo).mPictQ._M_elems[(long)__ptr._M_head_impl].mPts.__r <=
                         nVar21.__r);
                if (((((this_00->mVideo).mMovie)->mQuit)._M_base._M_i & 1U) != 0) goto LAB_0010563a;
                if (nVar21.__r < lVar19) goto LAB_001056f1;
LAB_0010571f:
                (this_00->mVideo).mPictQRead.super___atomic_base<unsigned_long>._M_i =
                     (__int_type_conflict)pMVar28;
                local_138._0_8_ = &(this_00->mVideo).mPictQMutex;
                local_138._8_8_ = (ulong)(uint7)local_138._9_7_ << 8;
                std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_138);
                local_138[8] = 1;
                std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_138);
                std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_138);
                std::condition_variable::notify_one();
                if ((this_00->mVideo).mImage == (SDL_Texture *)0x0) {
LAB_00105797:
                  pAVar23 = (this_00->mVideo).mCodecCtx._M_t.
                            super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>
                            ._M_t.
                            super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>
                            .super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl;
                  pSVar22 = (SDL_Texture *)
                            SDL_CreateTexture(local_140,0x56555949,1,pAVar23->coded_width,
                                              pAVar23->coded_height);
                  (this_00->mVideo).mImage = pSVar22;
                  if (pSVar22 == (SDL_Texture *)0x0) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,"Failed to create YV12 texture!",0x1e);
                    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x10);
                    std::ostream::put(-0x10);
                    std::ostream::flush();
                  }
                  pAVar23 = (this_00->mVideo).mCodecCtx._M_t.
                            super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>
                            ._M_t.
                            super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>
                            .super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl;
                  uVar16 = pAVar23->width;
                  __ptr._M_head_impl = (AVFrame *)(ulong)uVar16;
                  (this_00->mVideo).mWidth = uVar16;
                  iVar13 = pAVar23->height;
                  (this_00->mVideo).mHeight = iVar13;
                  bVar10 = 1;
                  if ((0 < iVar13 & 0 < (int)uVar16 & (this_00->mVideo).mFirstUpdate) == 1) {
                    (this_00->mVideo).mFirstUpdate = false;
                    if ((pAVar23->sample_aspect_ratio).den != 0) {
                      dVar8 = (double)(pAVar23->sample_aspect_ratio).num /
                              (double)(pAVar23->sample_aspect_ratio).den;
                      if (1.0 <= dVar8) {
                        __ptr._M_head_impl =
                             (AVFrame *)(ulong)(uint)(int)((double)(int)uVar16 * dVar8 + 0.5);
                      }
                      else if (0.0 < dVar8) {
                        iVar13 = (int)((double)iVar13 / dVar8 + 0.5);
                      }
                    }
                    pAVar23 = (AVCodecContext *)
                              SDL_SetWindowSize(local_108,__ptr._M_head_impl,iVar13);
                  }
                }
                else {
                  pAVar23 = (this_00->mVideo).mCodecCtx._M_t.
                            super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>
                            ._M_t.
                            super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>
                            .super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl;
                  if (((this_00->mVideo).mWidth != pAVar23->width) ||
                     ((this_00->mVideo).mHeight != pAVar23->height)) {
                    SDL_DestroyTexture();
                    goto LAB_00105797;
                  }
                  bVar10 = 0;
                }
                pSVar22 = (this_00->mVideo).mImage;
                if (pSVar22 != (SDL_Texture *)0x0) {
                  local_158._M_head_impl =
                       *(AVFrame **)
                        &(local_118->mFrame)._M_t.
                         super___uniq_ptr_impl<AVFrame,_(anonymous_namespace)::AVFrameDeleter>._M_t;
                  local_f8.__align = 0;
                  local_14c = 0;
                  if (((this_00->mVideo).mCodecCtx._M_t.
                       super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>
                       ._M_t.
                       super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>
                       .super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl)->pix_fmt ==
                      AV_PIX_FMT_YUV420P) {
                    in_stack_fffffffffffffe78 =
                         *(int **)&((AVIOContextPtr *)((long)local_158._M_head_impl + 0x10))->_M_t;
                    __ptr._M_head_impl = (AVFrame *)0x0;
                    pAVar23 = (AVCodecContext *)
                              SDL_UpdateYUVTexture
                                        (pSVar22,0,
                                         ((__uniq_ptr_impl<AVIOContext,_(anonymous_namespace)::AVIOContextDeleter>
                                           )*(__uniq_ptr_data<AVIOContext,_(anonymous_namespace)::AVIOContextDeleter,_true,_true>
                                              *)local_158._M_head_impl).
                                         super___uniq_ptr_impl<AVIOContext,_(anonymous_namespace)::AVIOContextDeleter>
                                         ,*(undefined4 *)
                                           &((PacketQueue<2097152UL> *)
                                            ((long)local_158._M_head_impl + 0x40))->mMutex,
                                         ((_Tuple_impl<0UL,_AVFormatContext_*,_(anonymous_namespace)::AVFormatCtxDeleter>
                                           )*(tuple<AVFormatContext_*,_(anonymous_namespace)::AVFormatCtxDeleter>
                                              *)&((AVIOContextPtr *)
                                                 ((long)local_158._M_head_impl + 8))->_M_t).
                                         super__Tuple_impl<0UL,_AVFormatContext_*,_(anonymous_namespace)::AVFormatCtxDeleter>
                                         ,*(undefined4 *)
                                           &((PacketQueue<2097152UL> *)
                                            ((long)local_158._M_head_impl + 0x44))->mMutex,
                                         in_stack_fffffffffffffe78,
                                         *(undefined4 *)
                                          &((PacketQueue<2097152UL> *)
                                           ((long)local_158._M_head_impl + 0x48))->mMutex);
                  }
                  else {
                    iVar13 = SDL_LockTexture(pSVar22,0,&local_f8,&local_14c);
                    if (iVar13 == 0) {
                      pAVar23 = (this_00->mVideo).mCodecCtx._M_t.
                                super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>
                                ._M_t.
                                super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>
                                .super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl;
                      pSVar30 = (this_00->mVideo).mSwscaleCtx._M_t.
                                super___uniq_ptr_impl<SwsContext,_(anonymous_namespace)::SwsContextDeleter>
                                ._M_t.
                                super__Tuple_impl<0UL,_SwsContext_*,_(anonymous_namespace)::SwsContextDeleter>
                                .super__Head_base<0UL,_SwsContext_*,_false>._M_head_impl;
                      local_d0 = (long)pAVar23->coded_width;
                      local_f8.__data.__list.__prev =
                           (__pthread_internal_list *)(long)pAVar23->coded_height;
                      iVar13 = pAVar23->height;
                      local_148 = (double)CONCAT44(local_148._4_4_,iVar13);
                      if (!(bool)(~bVar10 & pSVar30 != (SwsContext *)0x0)) {
                        __p = (pointer)sws_getContext(pAVar23->width,iVar13,pAVar23->pix_fmt,
                                                      pAVar23->width,iVar13,0,
                                                      (ulong)in_stack_fffffffffffffe78 &
                                                      0xffffffff00000000,0,0,0);
                        this = &(this_00->mVideo).mSwscaleCtx;
                        std::unique_ptr<SwsContext,_(anonymous_namespace)::SwsContextDeleter>::reset
                                  (this,__p);
                        pSVar30 = (this->_M_t).
                                  super___uniq_ptr_impl<SwsContext,_(anonymous_namespace)::SwsContextDeleter>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_SwsContext_*,_(anonymous_namespace)::SwsContextDeleter>
                                  .super__Head_base<0UL,_SwsContext_*,_false>._M_head_impl;
                      }
                      local_138._0_8_ = local_f8.__align;
                      local_138._8_8_ = local_f8._24_8_ * local_d0 + local_f8.__align;
                      iVar13 = (int)(local_f8._24_8_ * local_d0);
                      iVar15 = iVar13 + 3;
                      if (-1 < iVar13) {
                        iVar15 = iVar13;
                      }
                      local_138._16_8_ = (long)(iVar15 >> 2) + local_138._8_8_;
                      local_f8.__data.__owner = local_14c;
                      local_f8.__data.__nusers = local_14c / 2;
                      in_stack_fffffffffffffe78 = &local_f8.__data.__owner;
                      __ptr._M_head_impl = local_158._M_head_impl;
                      local_f8.__data.__kind = local_f8.__data.__nusers;
                      sws_scale(pSVar30,local_158._M_head_impl,
                                (PacketQueue<2097152UL> *)((long)local_158._M_head_impl + 0x40),0,
                                (ulong)local_148 & 0xffffffff,(MovieState *)local_138,
                                in_stack_fffffffffffffe78);
                      pAVar23 = (AVCodecContext *)SDL_UnlockTexture((this_00->mVideo).mImage);
                    }
                    else {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,"Failed to lock texture",0x16);
                      cVar11 = std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x10);
                      __ptr._M_head_impl = (AVFrame *)(ulong)(uint)(int)cVar11;
                      std::ostream::put(-0x10);
                      pAVar23 = (AVCodecContext *)std::ostream::flush();
                    }
                  }
                }
                uVar26 = CONCAT71((int7)((ulong)pAVar23 >> 8),1);
LAB_00105ab0:
                if ((this_00->mVideo).mImage != (SDL_Texture *)0x0) {
                  local_f8._24_4_ = (int)uVar26;
                  pAVar23 = (this_00->mVideo).mCodecCtx._M_t.
                            super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>
                            ._M_t.
                            super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>
                            .super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl;
                  if ((pAVar23->sample_aspect_ratio).num == 0) {
                    uVar4 = pAVar23->width;
                    uVar6 = pAVar23->height;
                    dVar8 = (double)(int)uVar4;
                    dVar9 = (double)(int)uVar6;
LAB_00105b1b:
                    local_148 = dVar8 / dVar9;
                  }
                  else {
                    uVar3 = pAVar23->width;
                    uVar5 = pAVar23->height;
                    dVar8 = (double)(int)uVar3;
                    dVar9 = (double)(int)uVar5;
                    local_148 = (((double)(pAVar23->sample_aspect_ratio).num /
                                 (double)(pAVar23->sample_aspect_ratio).den) * dVar8) / dVar9;
                    if (local_148 <= 0.0) goto LAB_00105b1b;
                  }
                  SDL_GetWindowSize(local_108,&local_f8,&local_14c);
                  local_158._M_head_impl._0_4_ = local_14c;
                  dVar8 = rint((double)local_14c * local_148);
                  uVar24 = (int)dVar8 + 3U & 0xfffffffc;
                  uVar14 = local_f8.__data.__lock;
                  uVar16 = (uint)local_158._M_head_impl;
                  if (local_f8.__data.__lock < (int)uVar24) {
                    dVar8 = rint((double)local_f8.__data.__lock / local_148);
                    uVar16 = (int)dVar8 + 3U & 0xfffffffc;
                    uVar24 = uVar14;
                  }
                  local_f8.__data.__owner = (int)(uVar14 - uVar24) / 2;
                  local_f8.__data.__nusers = (int)((uint)local_158._M_head_impl - uVar16) / 2;
                  local_138._0_8_ =
                       (__uniq_ptr_impl<AVIOContext,_(anonymous_namespace)::AVIOContextDeleter>)0x0;
                  local_138._8_8_ = *(undefined8 *)&(this_00->mVideo).mWidth;
                  __ptr._M_head_impl = (AVFrame *)(this_00->mVideo).mImage;
                  local_f8.__data.__kind = uVar24;
                  local_f8._20_4_ = uVar16;
                  SDL_RenderCopy(local_140,__ptr._M_head_impl,(MovieState *)local_138,
                                 &local_f8.__data.__owner);
                  SDL_RenderPresent(local_140);
                  uVar26 = (ulong)local_f8.__data.__list.__prev & 0xffffffff;
                }
                if ((char)uVar26 != '\0') {
                  local_158._M_head_impl = (AVFrame *)av_gettime();
                  __mutex = &(this_00->mVideo).mDispPtsMutex;
                  iVar13 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
                  if (iVar13 != 0) {
                    uVar20 = std::__throw_system_error(iVar13);
                    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_138)
                    ;
                    if (this_00 != (MovieState *)0x0) {
                      std::default_delete<(anonymous_namespace)::MovieState>::operator()
                                ((default_delete<(anonymous_namespace)::MovieState> *)this_00,
                                 (MovieState *)__ptr._M_head_impl);
                    }
                    _Unwind_Resume(uVar20);
                  }
                  (this_00->mVideo).mDisplayPts.__r = (local_118->mPts).__r;
                  (this_00->mVideo).mDisplayPtsTime.__r = (rep)local_158._M_head_impl;
                  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
                }
LAB_00105c59:
                if ((((this_00->mVideo).mEOS._M_base._M_i & 1U) != 0) &&
                   (puVar29 = (undefined1 *)
                              ((long)&(pMVar28->mIOContext)._M_t.
                                      super___uniq_ptr_impl<AVIOContext,_(anonymous_namespace)::AVIOContextDeleter>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_AVIOContext_*,_(anonymous_namespace)::AVIOContextDeleter>
                                      .super__Head_base<0UL,_AVIOContext_*,_false>._M_head_impl + 1)
                   , puVar29 + ((ulong)puVar29 / 3 & 0xfffffffffffffff8) * -3 ==
                     (undefined1 *)
                     (this_00->mVideo).mPictQWrite.super___atomic_base<unsigned_long>._M_i)) {
                  LOCK();
                  (this_00->mVideo).mFinalUpdate._M_base._M_i = true;
                  UNLOCK();
                  local_138._0_8_ = &(this_00->mVideo).mPictQMutex;
                  local_138._8_8_ = local_138._8_8_ & 0xffffffffffffff00;
                  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_138);
                  local_138[8] = 1;
                  std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_138);
LAB_0010567e:
                  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_138);
                  std::condition_variable::notify_one();
                }
              } while( true );
            }
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Could not start a video",0x17);
          std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
          return 1;
        }
        pcVar27 = "Failed to set up audio device";
        sVar17 = 0x1d;
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Could not initialize SDL - <<",0x1d);
      pcVar27 = (char *)SDL_GetError();
      if (pcVar27 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x1101f0);
        goto LAB_00104c25;
      }
      sVar17 = strlen(pcVar27);
    }
  }
LAB_00104c20:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar27,sVar17);
LAB_00104c25:
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x10);
  std::ostream::put(-0x10);
  std::ostream::flush();
  return 1;
}

Assistant:

int main(int argc, char *argv[])
{
    std::unique_ptr<MovieState> movState;

    if(argc < 2)
    {
        std::cerr<< "Usage: "<<argv[0]<<" [-device <device name>] [-direct] <files...>" <<std::endl;
        return 1;
    }
    /* Register all formats and codecs */
#if !(LIBAVFORMAT_VERSION_INT >= AV_VERSION_INT(58, 9, 100))
    av_register_all();
#endif
    /* Initialize networking protocols */
    avformat_network_init();

    if(SDL_Init(SDL_INIT_VIDEO | SDL_INIT_EVENTS))
    {
        std::cerr<< "Could not initialize SDL - <<"<<SDL_GetError() <<std::endl;
        return 1;
    }

    /* Make a window to put our video */
    SDL_Window *screen{SDL_CreateWindow(AppName.c_str(), 0, 0, 640, 480, SDL_WINDOW_RESIZABLE)};
    if(!screen)
    {
        std::cerr<< "SDL: could not set video mode - exiting" <<std::endl;
        return 1;
    }
    /* Make a renderer to handle the texture image surface and rendering. */
    Uint32 render_flags{SDL_RENDERER_ACCELERATED | SDL_RENDERER_PRESENTVSYNC};
    SDL_Renderer *renderer{SDL_CreateRenderer(screen, -1, render_flags)};
    if(renderer)
    {
        SDL_RendererInfo rinf{};
        bool ok{false};

        /* Make sure the renderer supports IYUV textures. If not, fallback to a
         * software renderer. */
        if(SDL_GetRendererInfo(renderer, &rinf) == 0)
        {
            for(Uint32 i{0u};!ok && i < rinf.num_texture_formats;i++)
                ok = (rinf.texture_formats[i] == SDL_PIXELFORMAT_IYUV);
        }
        if(!ok)
        {
            std::cerr<< "IYUV pixelformat textures not supported on renderer "<<rinf.name <<std::endl;
            SDL_DestroyRenderer(renderer);
            renderer = nullptr;
        }
    }
    if(!renderer)
    {
        render_flags = SDL_RENDERER_SOFTWARE | SDL_RENDERER_PRESENTVSYNC;
        renderer = SDL_CreateRenderer(screen, -1, render_flags);
    }
    if(!renderer)
    {
        std::cerr<< "SDL: could not create renderer - exiting" <<std::endl;
        return 1;
    }
    SDL_SetRenderDrawColor(renderer, 0, 0, 0, 255);
    SDL_RenderFillRect(renderer, nullptr);
    SDL_RenderPresent(renderer);

    /* Open an audio device */
    ++argv; --argc;
    if(InitAL(&argv, &argc))
    {
        std::cerr<< "Failed to set up audio device" <<std::endl;
        return 1;
    }

    {
        auto device = alcGetContextsDevice(alcGetCurrentContext());
        if(alcIsExtensionPresent(device, "ALC_SOFT_device_clock"))
        {
            std::cout<< "Found ALC_SOFT_device_clock" <<std::endl;
            alcGetInteger64vSOFT = reinterpret_cast<LPALCGETINTEGER64VSOFT>(
                alcGetProcAddress(device, "alcGetInteger64vSOFT")
            );
        }
    }

    if(alIsExtensionPresent("AL_SOFT_source_latency"))
    {
        std::cout<< "Found AL_SOFT_source_latency" <<std::endl;
        alGetSourcei64vSOFT = reinterpret_cast<LPALGETSOURCEI64VSOFT>(
            alGetProcAddress("alGetSourcei64vSOFT")
        );
    }
#ifdef AL_SOFT_events
    if(alIsExtensionPresent("AL_SOFT_events"))
    {
        std::cout<< "Found AL_SOFT_events" <<std::endl;
        alEventControlSOFT = reinterpret_cast<LPALEVENTCONTROLSOFT>(
            alGetProcAddress("alEventControlSOFT"));
        alEventCallbackSOFT = reinterpret_cast<LPALEVENTCALLBACKSOFT>(
            alGetProcAddress("alEventCallbackSOFT"));
    }
#endif
#ifdef AL_SOFT_callback_buffer
    if(alIsExtensionPresent("AL_SOFTX_callback_buffer"))
    {
        std::cout<< "Found AL_SOFT_callback_buffer" <<std::endl;
        alBufferCallbackSOFT = reinterpret_cast<LPALBUFFERCALLBACKSOFT>(
            alGetProcAddress("alBufferCallbackSOFT"));
    }
#endif

    int fileidx{0};
    for(;fileidx < argc;++fileidx)
    {
        if(strcmp(argv[fileidx], "-direct") == 0)
        {
            if(alIsExtensionPresent("AL_SOFT_direct_channels_remix"))
            {
                std::cout<< "Found AL_SOFT_direct_channels_remix" <<std::endl;
                DirectOutMode = AL_REMIX_UNMATCHED_SOFT;
            }
            else if(alIsExtensionPresent("AL_SOFT_direct_channels"))
            {
                std::cout<< "Found AL_SOFT_direct_channels" <<std::endl;
                DirectOutMode = AL_DROP_UNMATCHED_SOFT;
            }
            else
                std::cerr<< "AL_SOFT_direct_channels not supported for direct output" <<std::endl;
        }
        else if(strcmp(argv[fileidx], "-wide") == 0)
        {
            if(!alIsExtensionPresent("AL_EXT_STEREO_ANGLES"))
                std::cerr<< "AL_EXT_STEREO_ANGLES not supported for wide stereo" <<std::endl;
            else
            {
                std::cout<< "Found AL_EXT_STEREO_ANGLES" <<std::endl;
                EnableWideStereo = true;
            }
        }
        else if(strcmp(argv[fileidx], "-novideo") == 0)
            DisableVideo = true;
        else
            break;
    }

    while(fileidx < argc && !movState)
    {
        movState = std::unique_ptr<MovieState>{new MovieState{argv[fileidx++]}};
        if(!movState->prepare()) movState = nullptr;
    }
    if(!movState)
    {
        std::cerr<< "Could not start a video" <<std::endl;
        return 1;
    }
    movState->setTitle(screen);

    /* Default to going to the next movie at the end of one. */
    enum class EomAction {
        Next, Quit
    } eom_action{EomAction::Next};
    seconds last_time{seconds::min()};
    while(1)
    {
        SDL_Event event{};
        int have_evt{SDL_WaitEventTimeout(&event, 10)};

        auto cur_time = std::chrono::duration_cast<seconds>(movState->getMasterClock());
        if(cur_time != last_time)
        {
            auto end_time = std::chrono::duration_cast<seconds>(movState->getDuration());
            std::cout<< "    \r "<<PrettyTime{cur_time}<<" / "<<PrettyTime{end_time} <<std::flush;
            last_time = cur_time;
        }

        bool force_redraw{false};
        if(have_evt) do {
            switch(event.type)
            {
            case SDL_KEYDOWN:
                switch(event.key.keysym.sym)
                {
                case SDLK_ESCAPE:
                    movState->mQuit = true;
                    eom_action = EomAction::Quit;
                    break;

                case SDLK_n:
                    movState->mQuit = true;
                    eom_action = EomAction::Next;
                    break;

                default:
                    break;
                }
                break;

            case SDL_WINDOWEVENT:
                switch(event.window.event)
                {
                case SDL_WINDOWEVENT_RESIZED:
                    SDL_SetRenderDrawColor(renderer, 0, 0, 0, 255);
                    SDL_RenderFillRect(renderer, nullptr);
                    force_redraw = true;
                    break;

                case SDL_WINDOWEVENT_EXPOSED:
                    force_redraw = true;
                    break;

                default:
                    break;
                }
                break;

            case SDL_QUIT:
                movState->mQuit = true;
                eom_action = EomAction::Quit;
                break;

            case FF_MOVIE_DONE_EVENT:
                std::cout<<'\n';
                last_time = seconds::min();
                if(eom_action != EomAction::Quit)
                {
                    movState = nullptr;
                    while(fileidx < argc && !movState)
                    {
                        movState = std::unique_ptr<MovieState>{new MovieState{argv[fileidx++]}};
                        if(!movState->prepare()) movState = nullptr;
                    }
                    if(movState)
                    {
                        movState->setTitle(screen);
                        break;
                    }
                }

                /* Nothing more to play. Shut everything down and quit. */
                movState = nullptr;

                CloseAL();

                SDL_DestroyRenderer(renderer);
                renderer = nullptr;
                SDL_DestroyWindow(screen);
                screen = nullptr;

                SDL_Quit();
                exit(0);

            default:
                break;
            }
        } while(SDL_PollEvent(&event));

        movState->mVideo.updateVideo(screen, renderer, force_redraw);
    }

    std::cerr<< "SDL_WaitEvent error - "<<SDL_GetError() <<std::endl;
    return 1;
}